

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

value_type __thiscall
djb::microfacet::sample(microfacet *this,vec2 *u,vec3 *wi,vec3 *wo_out,float_t *pdf,void *user_args)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  impl *piVar4;
  long lVar5;
  _func_int **pp_Var6;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar7;
  args *paVar8;
  float_t fVar9;
  float_t fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  value_type vVar15;
  float_t *in_stack_00000008;
  value_type F;
  args args;
  vec3 local_c0;
  undefined4 uStack_b4;
  float *local_b0;
  vec3 local_a8;
  args local_9c;
  vec3 local_50;
  undefined8 local_40;
  float local_38;
  
  if (wo_out->z <= 0.0) {
    if (pdf != (float_t *)0x0) {
      pdf[0] = 0.0;
      pdf[1] = 0.0;
      pdf[2] = 0.0;
    }
    if (user_args != (void *)0x0) {
      *(undefined4 *)user_args = 0;
    }
    (**(code **)((long)*u + 0x10))(this,u);
    pfVar7 = extraout_RDX;
  }
  else {
    local_b0 = (float *)user_args;
    if (in_stack_00000008 == (float_t *)0x0) {
      local_c0._0_8_ = (_func_int **)0x0;
      local_c0.z = 1.0;
      microfacet::args::normalmap(&local_9c,&local_c0,1.0,1.0,0.0);
    }
    else {
      paVar8 = &local_9c;
      for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
        (paVar8->mtra).r[0].x = *in_stack_00000008;
        in_stack_00000008 = in_stack_00000008 + 1;
        paVar8 = (args *)&(paVar8->mtra).r[0].y;
      }
    }
    local_50 = u2_to_h2((microfacet *)u,(vec2 *)wi,wo_out,&local_9c);
    uVar1 = wo_out->x;
    uVar2 = wo_out->y;
    fVar13 = wo_out->z * local_50.z + (float)uVar1 * local_50.x + (float)uVar2 * local_50.y;
    fVar14 = fVar13 + fVar13;
    local_a8.z = local_50.z * fVar14 - wo_out->z;
    local_a8.y = fVar14 * local_50.y - (float)uVar2;
    local_a8.x = fVar14 * local_50.x - (float)uVar1;
    fVar9 = gcd((microfacet *)u,&local_50,wo_out,&local_a8,&local_9c);
    (**(code **)(*(long *)u[1] + 0x20))(fVar13,&local_c0);
    pfVar7 = local_b0;
    if (pdf != (float_t *)0x0) {
      pdf[2] = local_a8.z;
      pdf[0] = local_a8.x;
      pdf[1] = local_a8.y;
    }
    if (local_b0 != (float *)0x0) {
      fVar10 = ndf((microfacet *)u,&local_50,&local_9c);
      fVar13 = wo_out->x;
      fVar14 = wo_out->y;
      fVar12 = wo_out->z;
      local_38 = local_9c.minv.r[2].z * fVar12 +
                 local_9c.minv.r[2].x * fVar13 + local_9c.minv.r[2].y * fVar14;
      fVar11 = fVar12 * local_9c.minv.r[0].z +
               fVar13 * local_9c.minv.r[0].x + local_9c.minv.r[0].y * fVar14;
      fVar13 = fVar12 * local_9c.minv.r[1].z +
               fVar13 * local_9c.minv.r[1].x + local_9c.minv.r[1].y * fVar14;
      fVar12 = SQRT(local_38 * local_38 + fVar11 * fVar11 + fVar13 * fVar13);
      fVar14 = 1.0 / fVar12;
      local_38 = local_38 * fVar14;
      local_40 = CONCAT44(fVar14 * fVar13,fVar14 * fVar11);
      fVar13 = (float)(**(code **)((long)*u + 0x50))(u);
      *pfVar7 = fVar10 / (fVar12 * fVar13 * 4.0);
    }
    uVar3 = local_c0._0_8_;
    (this->super_brdf)._vptr_brdf = (_func_int **)local_c0._0_8_;
    piVar4 = (impl *)operator_new(local_c0._0_8_ * 4);
    (this->m_fresnel).m_f = piVar4;
    if ((_func_int **)uVar3 != (_func_int **)0x0) {
      pp_Var6 = (_func_int **)0x0;
      do {
        *(float *)((long)&piVar4->_vptr_impl + (long)pp_Var6 * 4) =
             *(float *)((long)CONCAT44(uStack_b4,local_c0.z) + (long)pp_Var6 * 4) * fVar9;
        pp_Var6 = (_func_int **)((long)pp_Var6 + 1);
      } while ((_func_int **)uVar3 != pp_Var6);
    }
    operator_delete((void *)CONCAT44(uStack_b4,local_c0.z));
    pfVar7 = extraout_RDX_00;
  }
  vVar15._M_data = pfVar7;
  vVar15._M_size = (size_t)this;
  return vVar15;
}

Assistant:

brdf::value_type
microfacet::sample(
	const vec2 &u,
	const vec3 &wi,
	vec3 *wo_out,
	float_t *pdf,
	const void *user_args
) const {
	if (wi.z > 0) {
		microfacet::args args =
			user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
			          : microfacet::args::standard();
		vec3 wm = u2_to_h2(u, wi, args);
		vec3 wo = h2_to_s2(wm, wi);
		float_t zd = dot(wi, wm);
		float_t Gcd = gcd(wm, wi, wo, args);
		brdf::value_type F = m_fresnel->eval(zd);

		if (wo_out) (*wo_out) = wo;
		if (pdf) (*pdf) = ndf(wm, args) / (4 * sigma(wi, args));

		return F * Gcd;
	} else {
		if (wo_out) (*wo_out) = vec3(0);
		if (pdf) (*pdf) = 0;

		return zero_value();
	}
}